

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O3

void __thiscall bandit::reporter::spec::context_starting(spec *this,string *desc)

{
  ostream *poVar1;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  progress_base::context_starting((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  poVar1 = (this->super_colored_base).stm_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"describe ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

void context_starting(const std::string& desc) override {
        progress_base::context_starting(desc);

        stm_ << indent();
        stm_ << "describe " << desc << std::endl;
        increase_indent();
        stm_.flush();
      }